

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_model(Net *this,uchar *_mem)

{
  Layer *pLVar1;
  int iVar2;
  pointer ppLVar3;
  ulong uVar4;
  uchar *mem;
  ModelBinFromMemory mb;
  uchar *local_70;
  ModelBinFromMemory local_68;
  Option local_58;
  
  if ((this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    load_model();
  }
  else {
    if (((ulong)_mem & 3) == 0) {
      Option::Option(&local_58);
      local_58.vulkan_compute = this->use_vulkan_compute != 0;
      local_58.use_winograd_convolution = this->use_winograd_convolution;
      local_58.use_sgemm_convolution = this->use_sgemm_convolution;
      local_58.use_int8_inference = this->use_int8_inference;
      local_70 = _mem;
      ModelBinFromMemory::ModelBinFromMemory(&local_68,&local_70);
      ppLVar3 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppLVar3) {
        uVar4 = 0;
        do {
          pLVar1 = ppLVar3[uVar4];
          if (pLVar1 == (Layer *)0x0) {
            fprintf(_stderr,
                    "load_model error at layer %d, parameter file has inconsistent content.\n",
                    uVar4 & 0xffffffff);
            return -1;
          }
          iVar2 = (*pLVar1->_vptr_Layer[3])(pLVar1,&local_68);
          if (iVar2 != 0) {
            load_model();
            return -1;
          }
          iVar2 = (*pLVar1->_vptr_Layer[4])(pLVar1,&local_58);
          if (iVar2 != 0) {
            load_model();
            return -1;
          }
          uVar4 = uVar4 + 1;
          ppLVar3 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar4 < (ulong)((long)(this->layers).
                                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar3 >>
                                3));
      }
      return (int)local_70 - (int)_mem;
    }
    fprintf(_stderr,"memory not 32-bit aligned at %p\n",_mem);
  }
  return -1;
}

Assistant:

int Net::upload_model()
{
    ncnn::VkTransfer cmd(vkdev);

    // create gpu device allocator if null
    if (!weight_vkallocator)
    {
        weight_vkallocator = new VkWeightBufferAllocator(vkdev);
    }
    if (!weight_staging_vkallocator)
    {
        weight_staging_vkallocator = new VkWeightStagingBufferAllocator(vkdev);
    }

    cmd.weight_vkallocator = weight_vkallocator;
    cmd.staging_vkallocator = weight_staging_vkallocator;

    for (size_t i=0; i<layers.size(); i++)
    {
        if (layers[i]->support_vulkan)
        {
            int uret = layers[i]->upload_model(cmd);
            if (uret != 0)
            {
                fprintf(stderr, "layer upload_model %d failed\n", (int)i);
                return -1;
            }
        }
    }

    cmd.submit_and_wait();

    return 0;
}